

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::quickCoreQueries_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view queryStr)

{
  long lVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_t __n;
  char *pcVar9;
  char *pcVar10;
  size_type __rlen;
  bool bVar11;
  string_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  data local_40;
  
  pcVar10 = queryStr._M_str;
  __n = queryStr._M_len;
  lVar1 = __n - 4;
  switch(lVar1) {
  case 0:
switchD_002ac2dc_caseD_0:
    iVar4 = bcmp(pcVar10,"name",__n);
    if (iVar4 == 0) goto LAB_002ac427;
    if (__n != 6) {
      if (__n == 7) goto switchD_002ac381_caseD_3;
      if (__n != 10) goto switchD_002ac2dc_caseD_1;
      goto switchD_002ac2dc_caseD_6;
    }
switchD_002ac2dc_caseD_2:
    iVar4 = bcmp(pcVar10,"exists",__n);
    if (iVar4 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "true";
      pcVar9 = "";
LAB_002ac64e:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar10,pcVar9);
      return __return_storage_ptr__;
    }
    if (__n == 7) {
switchD_002ac381_caseD_3:
      iVar4 = bcmp(pcVar10,"version",__n);
      if (iVar4 == 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"","");
        pbVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                           (&local_68,"3.6.1 (2025-02-24)");
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if (paVar8 == paVar7) {
          local_88.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_88.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_88._M_dataplus._M_p = (pointer)paVar8;
        }
        local_88._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,&local_88,'\"');
LAB_002ac712:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
    }
switchD_002ac2dc_caseD_1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  default:
    goto switchD_002ac2dc_caseD_1;
  case 2:
    goto switchD_002ac2dc_caseD_2;
  case 3:
    iVar4 = bcmp(pcVar10,"queries",__n);
    if (iVar4 == 0) goto LAB_002ac48a;
    switch(lVar1) {
    case 0:
      goto switchD_002ac2dc_caseD_0;
    default:
      goto switchD_002ac2dc_caseD_1;
    case 2:
      goto switchD_002ac2dc_caseD_2;
    case 3:
      goto switchD_002ac381_caseD_3;
    case 6:
      goto switchD_002ac2dc_caseD_6;
    case 7:
      goto switchD_002ac2dc_caseD_7;
    case 0xd:
      goto switchD_002ac2dc_caseD_d;
    }
  case 6:
switchD_002ac2dc_caseD_6:
    iVar4 = bcmp(pcVar10,"identifier",__n);
    if (iVar4 == 0) {
LAB_002ac427:
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"","");
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_68,(this->super_BrokerBase).identifier._M_dataplus._M_p,
                           (this->super_BrokerBase).identifier._M_string_length);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if (paVar8 == paVar7) {
        local_88.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_88.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_88._M_dataplus._M_p = (pointer)paVar8;
      }
      local_88._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_replace_aux(&local_88,local_88._M_string_length,0,1,'\"');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      paVar8 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar8) {
        uVar3 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      goto LAB_002ac712;
    }
    if (__n != 7) {
      if (__n != 6) goto switchD_002ac2dc_caseD_1;
      goto switchD_002ac2dc_caseD_2;
    }
    goto switchD_002ac381_caseD_3;
  case 7:
switchD_002ac2dc_caseD_7:
    iVar4 = bcmp(pcVar10,"isconnected",__n);
    if (iVar4 == 0) {
      bVar11 = (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7;
      pcVar10 = "false";
      if (bVar11) {
        pcVar10 = "true";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = pcVar10 + (5 - (ulong)bVar11);
      goto LAB_002ac64e;
    }
    switch(lVar1) {
    case 0:
      goto switchD_002ac2dc_caseD_0;
    default:
      goto switchD_002ac2dc_caseD_1;
    case 2:
      goto switchD_002ac2dc_caseD_2;
    case 3:
      goto switchD_002ac381_caseD_3;
    case 6:
      goto switchD_002ac2dc_caseD_6;
    }
  case 0xd:
switchD_002ac2dc_caseD_d:
    iVar4 = bcmp(pcVar10,"available_queries",__n);
    if (iVar4 == 0) {
LAB_002ac48a:
      local_48 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
      __return_storage_ptr__->_M_string_length = 1;
      if (querySet_abi_cxx11_._24_8_ != 0x4fb7d8) {
        p_Var5 = (_Rb_tree_node_base *)querySet_abi_cxx11_._24_8_;
        do {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,*(long *)(p_Var5 + 1),
                     (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68)
          ;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_88,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_40);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,local_88._M_dataplus._M_p,local_88._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != (_Rb_tree_node_base *)(querySet_abi_cxx11_ + 8));
      }
      if (1 < __return_storage_ptr__->_M_string_length) {
        (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] =
             ']';
        return __return_storage_ptr__;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
      return __return_storage_ptr__;
    }
    switch(lVar1) {
    case 0:
      goto switchD_002ac2dc_caseD_0;
    default:
      goto switchD_002ac2dc_caseD_1;
    case 2:
      goto switchD_002ac2dc_caseD_2;
    case 3:
      goto switchD_002ac381_caseD_3;
    case 6:
      goto switchD_002ac2dc_caseD_6;
    case 7:
      goto switchD_002ac2dc_caseD_7;
    }
  }
}

Assistant:

std::string CommonCore::quickCoreQueries(std::string_view queryStr) const
{
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return generateStringVector(querySet, [](const std::string& data) { return data; });
    }
    if (queryStr == "isconnected") {
        return (isConnected()) ? "true" : "false";
    }
    if (queryStr == "name" || queryStr == "identifier") {
        return std::string{"\""} + getIdentifier() + '"';
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    return std::string{};
}